

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O3

SpatialForceVector * __thiscall
iDynTree::TransformDerivative::transform
          (SpatialForceVector *__return_storage_ptr__,TransformDerivative *this,Transform *transform
          ,SpatialForceVector *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  PointerType ptr;
  Position *pPVar19;
  Rotation *pRVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = 0.0;
  __return_storage_ptr__->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_0015ec98
  ;
  pPVar19 = Transform::getPosition(transform);
  pRVar20 = Transform::getRotation(transform);
  dVar7 = (this->rotDerivative).m_data[0];
  dVar8 = (this->rotDerivative).m_data[1];
  dVar9 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [0];
  dVar10 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.
           m_data[1];
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [2];
  dVar11 = (this->rotDerivative).m_data[3];
  dVar12 = (this->rotDerivative).m_data[4];
  dVar2 = (this->rotDerivative).m_data[5];
  dVar22 = dVar1 * dVar2 + dVar10 * dVar12 + dVar9 * dVar11;
  dVar13 = (this->rotDerivative).m_data[6];
  dVar14 = (this->rotDerivative).m_data[7];
  dVar3 = (this->rotDerivative).m_data[8];
  dVar4 = (this->rotDerivative).m_data[2];
  dVar25 = dVar3 * dVar1 + dVar10 * dVar14 + dVar9 * dVar13;
  dVar26 = dVar4 * dVar1 + dVar8 * dVar10 + dVar7 * dVar9;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[0] = dVar26;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[1] = dVar22;
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.
  super_Vector3.m_data[2] = dVar25;
  dVar15 = (pPVar19->super_Vector3).m_data[1];
  dVar16 = (pPVar19->super_Vector3).m_data[2];
  dVar5 = (pPVar19->super_Vector3).m_data[0];
  dVar21 = dVar1 * (pRVar20->super_Matrix3x3).m_data[5] +
           (pRVar20->super_Matrix3x3).m_data[4] * dVar10 +
           (pRVar20->super_Matrix3x3).m_data[3] * dVar9;
  dVar6 = (this->posDerivative).m_data[0];
  dVar23 = (pRVar20->super_Matrix3x3).m_data[8] * dVar1 +
           (pRVar20->super_Matrix3x3).m_data[7] * dVar10 +
           (pRVar20->super_Matrix3x3).m_data[6] * dVar9;
  dVar24 = (pRVar20->super_Matrix3x3).m_data[2] * dVar1 +
           (pRVar20->super_Matrix3x3).m_data[1] * dVar10 +
           (pRVar20->super_Matrix3x3).m_data[0] * dVar9;
  dVar9 = (this->posDerivative).m_data[1];
  dVar10 = (this->posDerivative).m_data[2];
  dVar17 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
           m_data[0];
  dVar18 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
           m_data[1];
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
          m_data[2];
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[0] =
       dVar1 * dVar4 + dVar8 * dVar18 + dVar7 * dVar17 + (dVar15 * dVar25 - dVar22 * dVar16) +
       (dVar9 * dVar23 - dVar21 * dVar10);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[1] =
       dVar1 * dVar2 + dVar12 * dVar18 + dVar11 * dVar17 + (dVar16 * dVar26 - dVar25 * dVar5) +
       (dVar10 * dVar24 - dVar23 * dVar6);
  (__return_storage_ptr__->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.
  super_Vector3.m_data[2] =
       dVar14 * dVar18 + dVar13 * dVar17 + dVar3 * dVar1 + (dVar5 * dVar22 - dVar26 * dVar15) +
       (dVar6 * dVar21 - dVar24 * dVar9);
  return __return_storage_ptr__;
}

Assistant:

SpatialForceVector TransformDerivative::transform(const Transform& transform,
                                                  SpatialForceVector& other)
{
    SpatialForceVector ret;

    Eigen::Map<const Eigen::Vector3d> p(transform.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(transform.getRotation().data());
    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    toEigen(ret.getLinearVec3()) = dR*toEigen(other.getLinearVec3());
    toEigen(ret.getAngularVec3())  =  dR*toEigen(other.getAngularVec3())
                                    + p.cross(toEigen(ret.getLinearVec3()))
                                    + dp.cross(R*toEigen(other.getLinearVec3()));

    return ret;
}